

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O3

int sbisect(int np,poly *sseq,double min,double max,int atmin,int atmax,double *roots)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  uVar1 = atmin - atmax;
  while (uVar1 != 1) {
    iVar4 = 800;
    while( true ) {
      dVar9 = (max + min) * 0.5;
      iVar5 = numchanges(np,sseq,dVar9);
      uVar8 = iVar5 - atmax;
      if (uVar8 != 0 && atmin - iVar5 != 0) break;
      dVar10 = dVar9;
      if (atmin - iVar5 != 0) {
        dVar10 = min;
        max = dVar9;
      }
      min = dVar10;
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        fwrite("sbisect: roots too close together\n",0x22,1,_stderr);
        fprintf(_stderr,
                "sbisect: overflow min %f max %f diff %e\t\t\t\t\t\t                      nroot %d n1 %d n2 %d\n"
                ,min,max,max - min,(ulong)uVar1,(ulong)(uint)(atmin - iVar5),(ulong)uVar8);
        auVar3 = _DAT_00181020;
        auVar2 = _DAT_00181010;
        if (atmin <= atmax) {
          return 1;
        }
        lVar6 = ((long)atmin - (long)atmax) + -1;
        auVar11._8_4_ = (int)lVar6;
        auVar11._0_8_ = lVar6;
        auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
        uVar7 = 0;
        auVar11 = auVar11 ^ _DAT_00181020;
        do {
          auVar12._8_4_ = (int)uVar7;
          auVar12._0_8_ = uVar7;
          auVar12._12_4_ = (int)(uVar7 >> 0x20);
          auVar12 = (auVar12 | auVar2) ^ auVar3;
          if ((bool)(~(auVar12._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar12._0_4_ ||
                      auVar11._4_4_ < auVar12._4_4_) & 1)) {
            roots[uVar7] = dVar9;
          }
          if ((auVar12._12_4_ != auVar11._12_4_ || auVar12._8_4_ <= auVar11._8_4_) &&
              auVar12._12_4_ <= auVar11._12_4_) {
            roots[uVar7 + 1] = dVar9;
          }
          uVar7 = uVar7 + 2;
        } while ((((long)atmin - (long)atmax) + 1U & 0xfffffffffffffffe) != uVar7);
        return 1;
      }
    }
    sbisect(np,sseq,min,dVar9,atmin,iVar5,roots);
    roots = roots + (atmin - iVar5);
    uVar1 = uVar8;
    min = dVar9;
    atmin = iVar5;
  }
  iVar4 = modrf(sseq->ord,sseq->coef,min,max,roots);
  if (iVar4 == 0) {
    iVar4 = 800;
    do {
      dVar9 = (max + min) * 0.5;
      iVar5 = numchanges(np,sseq,dVar9);
      dVar10 = max - min;
      if (1e-12 < ABS(dVar9)) {
        dVar10 = dVar10 / dVar9;
      }
      if (ABS(dVar10) < 1e-12) goto LAB_0015e4df;
      dVar10 = dVar9;
      if (iVar5 != atmin) {
        dVar10 = min;
        max = dVar9;
      }
      iVar4 = iVar4 + -1;
      min = dVar10;
    } while (iVar4 != 0);
    fprintf(_stderr,
            "sbisect: overflow min %f max %f\t\t\t\t\t\t\t                         diff %e nroot %d n1 %d n2 %d\n"
            ,dVar10,max,max - dVar10,1,0,0);
LAB_0015e4df:
    *roots = dVar9;
  }
  return 1;
}

Assistant:

int sbisect(int np, poly *sseq,
	double min, double max,
	int atmin, int atmax,
	double *roots)
{
	double mid;
	int atmid;
	int its;
	int  n1 = 0, n2 = 0;
	int nroot = atmin - atmax;

	if (nroot == 1) {

		/* first try a less expensive technique.  */
		if (modrf(sseq->ord, sseq->coef, min, max, &roots[0]))
			return 1;

		/*
		* if we get here we have to evaluate the root the hard
		* way by using the Sturm sequence.
		*/
		for (its = 0; its < MAXIT; its++) {
			mid = (double)((min + max) / 2);
			atmid = numchanges(np, sseq, mid);

			if (fabs(mid) > RELERROR) {
				if (fabs((max - min) / mid) < RELERROR) {
					roots[0] = mid;
					return 1;
				}
			}
			else if (fabs(max - min) < RELERROR) {
				roots[0] = mid;
				return 1;
			}

			if ((atmin - atmid) == 0)
				min = mid;
			else
				max = mid;
		}

		if (its == MAXIT) {
			fprintf(stderr, "sbisect: overflow min %f max %f\
							                         diff %e nroot %d n1 %d n2 %d\n",
													 min, max, max - min, nroot, n1, n2);
			roots[0] = mid;
		}

		return 1;
	}

	/* more than one root in the interval, we have to bisect */
	for (its = 0; its < MAXIT; its++) {

		mid = (double)((min + max) / 2);
		atmid = numchanges(np, sseq, mid);

		n1 = atmin - atmid;
		n2 = atmid - atmax;

		if (n1 != 0 && n2 != 0) {
			sbisect(np, sseq, min, mid, atmin, atmid, roots);
			sbisect(np, sseq, mid, max, atmid, atmax, &roots[n1]);
			break;
		}

		if (n1 == 0)
			min = mid;
		else
			max = mid;
	}

	if (its == MAXIT) {
		fprintf(stderr, "sbisect: roots too close together\n");
		fprintf(stderr, "sbisect: overflow min %f max %f diff %e\
						                      nroot %d n1 %d n2 %d\n",
											  min, max, max - min, nroot, n1, n2);
		for (n1 = atmax; n1 < atmin; n1++)
			roots[n1 - atmax] = mid;
	}

	return 1;
}